

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O1

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::NotNullConstraint::Deserialize(NotNullConstraint *this,Deserializer *deserializer)

{
  LogicalIndex index;
  NotNullConstraint *this_00;
  undefined4 extraout_var;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"index");
  index.index._0_4_ = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  index.index._4_4_ = extraout_var;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (NotNullConstraint *)operator_new(0x18);
  NotNullConstraint(this_00,index);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)this_00;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> NotNullConstraint::Deserialize(Deserializer &deserializer) {
	auto index = deserializer.ReadProperty<LogicalIndex>(200, "index");
	auto result = duckdb::unique_ptr<NotNullConstraint>(new NotNullConstraint(index));
	return std::move(result);
}